

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_custom_search_visitor.cpp
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  long *plVar2;
  size_t in_RDX;
  search_nn_counter<pico_tree::neighbor<int,_float>_> v;
  max_leaf_size_t max_leaf_size;
  neighbor nn;
  kd_tree tree;
  search_nn_counter<pico_tree::neighbor<int,_float>_> local_100;
  vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_> local_f0;
  Elems__ local_d8;
  undefined8 local_d0;
  neighbor_type local_c8;
  void *local_c0 [2];
  long local_b0;
  vector<int,_std::allocator<int>_> local_a0;
  undefined **local_78;
  undefined8 *local_70;
  node_type *local_58;
  search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point<float,_2UL>_>,_search_nn_counter<pico_tree::neighbor<int,_float>_>,_int>
  local_50;
  
  local_d0 = 0xc;
  pico_tree::generate_random_n<pico_tree::point<float,2ul>>
            (&local_f0,(pico_tree *)&Elf64_Ehdr_00100000,in_RDX,0.0,1000.0);
  pico_tree::
  kd_tree<std::vector<pico_tree::point<float,2ul>,std::allocator<pico_tree::point<float,2ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            ((kd_tree<std::vector<pico_tree::point<float,2ul>,std::allocator<pico_tree::point<float,2ul>>>,pico_tree::metric_l2_squared,int>
              *)local_c0,&local_f0,
             (splitter_stop_condition_t<pico_tree::max_leaf_size_t> *)&local_d0,
             (splitter_start_bounds_t<pico_tree::bounds_from_space_t> *)&local_50,
             (splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *)&local_100);
  if (local_f0.
      super__Vector_base<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.
                    super__Vector_base<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.
                          super__Vector_base<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.
                          super__Vector_base<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_50.query_.point_ = (point_type *)&local_d8;
  local_d8._M_elems[0] = 500.0;
  local_d8._M_elems[1] = 500.0;
  local_100.count_ = 0;
  local_100.nn_ = &local_c8;
  local_c8.distance = 3.4028235e+38;
  local_50.indices_ = &local_a0;
  local_50.node_box_offset_.elems_._M_elems = (Elems__)(_Type)0x0;
  local_50.space_.space_ = (space_type *)local_c0;
  local_50.visitor_ = &local_100;
  pico_tree::internal::
  search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point<float,_2UL>_>,_search_nn_counter<pico_tree::neighbor<int,_float>_>,_int>
  ::search_nearest(&local_50,local_58,0.0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of points visited: ",0x1a);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_100.count_);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  local_78 = &PTR__list_pool_resource_00105d98;
  while (local_70 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*local_70;
    operator_delete(local_70,0x2008);
    local_70 = puVar1;
  }
  if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0[0] != (void *)0x0) {
    operator_delete(local_c0[0],local_b0 - (long)local_c0[0]);
  }
  return 0;
}

Assistant:

int main() {
  using point = pico_tree::point_2f;
  using scalar = typename point::scalar_type;

  pico_tree::max_leaf_size_t max_leaf_size = 12;
  std::size_t point_count = 1024 * 1024;
  scalar area_size = 1000;

  using kd_tree = pico_tree::kd_tree<std::vector<point>>;
  using neighbor = typename kd_tree::neighbor_type;

  kd_tree tree(
      pico_tree::generate_random_n<point>(point_count, area_size),
      max_leaf_size);

  point q{area_size / scalar(2.0), area_size / scalar(2.0)};
  neighbor nn;
  search_nn_counter<neighbor> v(nn);
  tree.search_nearest(q, v);

  std::cout << "Number of points visited: " << v.count() << std::endl;

  return 0;
}